

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t
exr_start_write(exr_context_t *ctxt,char *filename,exr_default_write_mode_t default_mode,
               exr_context_initializer_t *ctxtdata)

{
  size_t sVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *p_Var2;
  exr_context_t p_Var3;
  exr_result_t eVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t __n;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  size_t __n_00;
  ulong uVar11;
  char *pcVar12;
  exr_context_t ret;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char local_b8 [32];
  exr_context_initializer_t inits;
  
  ret = (exr_context_t)0x0;
  fill_context_data(&inits,ctxtdata);
  if (ctxt == (exr_context_t *)0x0) {
    (*inits.error_handler_fn)
              ((exr_const_context_t)0x0,3,"Invalid context handle passed to start_read function");
    return 3;
  }
  if (filename == (char *)0x0) {
    iVar5 = 3;
    (*inits.error_handler_fn)
              ((exr_const_context_t)0x0,3,"Invalid filename passed to start_write function");
    goto LAB_001136ed;
  }
  iVar5 = 1;
  eVar4 = internal_exr_alloc_context(&ret,&inits,EXR_CONTEXT_WRITE,4);
  if (eVar4 != 0) goto LAB_001136ed;
  ret->do_write = dispatch_write;
  iVar5 = exr_attr_string_create(ret,&ret->filename,filename);
  p_Var3 = ret;
  if ((iVar5 == 0) && (inits.write_fn == (exr_write_func_ptr_t)0x0)) {
    if (default_mode != EXR_INTERMEDIATE_TEMP_FILE) {
LAB_00113662:
      p_Var3 = ret;
      pcVar10 = (ret->tmp_filename).str;
      piVar9 = (int *)ret->user_data;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (ret->filename).str;
      }
      *piVar9 = -1;
      ret->destroy_fn = default_shutdown;
      ret->write_fn = default_write_func;
      iVar5 = 0;
      iVar7 = open(pcVar10,0x80241,0x1b6);
      if (-1 < iVar7) {
        *piVar9 = iVar7;
        goto LAB_001136ed;
      }
      p_Var2 = p_Var3->print_error;
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      iVar5 = (*p_Var2)(p_Var3,5,"Unable to open file for write: %s",pcVar10);
      goto LAB_001136dd;
    }
    pcVar10 = (ret->filename).str;
    uVar6 = getpid();
    iVar5 = snprintf(local_b8,0x20,"tmp.%d",(ulong)uVar6);
    if (iVar5 < 0x20) {
      __n = strlen(local_b8);
      uVar11 = (long)(p_Var3->filename).length + __n;
      if (uVar11 < 0x7fffffff) {
        sVar1 = uVar11 + 1;
        local_d0 = (char *)(*p_Var3->alloc_fn)(sVar1);
        if (local_d0 != (char *)0x0) {
          pcVar8 = strrchr(pcVar10,0x2f);
          pcVar12 = local_d0;
          (p_Var3->tmp_filename).length = (int32_t)uVar11;
          (p_Var3->tmp_filename).alloc_size = (int32_t)sVar1;
          (p_Var3->tmp_filename).str = local_d0;
          if (pcVar8 == (char *)0x0) {
            memcpy(local_d0,local_b8,__n);
            __n_00 = (size_t)(p_Var3->filename).length;
            pcVar8 = pcVar12;
          }
          else {
            local_c0 = pcVar8 + (1 - (long)pcVar10);
            memcpy(local_d0,pcVar10,(size_t)local_c0);
            pcVar12 = local_d0;
            local_c8 = local_d0 + (long)(pcVar8 + (1 - (long)pcVar10));
            memcpy(local_c8,local_b8,__n);
            pcVar10 = pcVar8 + 1;
            __n_00 = (long)(p_Var3->filename).length - (long)local_c0;
            pcVar8 = local_c8;
          }
          memcpy(pcVar8 + __n,pcVar10,__n_00);
          pcVar12[uVar11] = '\0';
          goto LAB_00113662;
        }
        iVar5 = (*p_Var3->print_error)
                          (p_Var3,1,"Unable to create %lu bytes for temporary filename",sVar1);
      }
      else {
        iVar5 = (*p_Var3->standard_error)(p_Var3,1);
      }
    }
    else {
      iVar5 = (*p_Var3->report_error)(p_Var3,3,"Invalid assumption in temporary filename");
    }
    if (iVar5 == 0) goto LAB_00113662;
  }
  else {
LAB_001136dd:
    if (iVar5 == 0) {
      iVar5 = 0;
      goto LAB_001136ed;
    }
  }
  exr_finish(&ret);
LAB_001136ed:
  *ctxt = ret;
  return iVar5;
}

Assistant:

exr_result_t
exr_start_write (
    exr_context_t*                   ctxt,
    const char*                      filename,
    exr_default_write_mode_t         default_mode,
    const exr_context_initializer_t* ctxtdata)
{
    int                       rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename)
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_WRITE,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_write = &dispatch_write;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);

            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.write_fn)
                {
                    if (default_mode == EXR_INTERMEDIATE_TEMP_FILE)
                        rv = make_temp_filename (ret);
                    if (rv == EXR_ERR_SUCCESS)
                        rv = default_init_write_file (ret);
                }
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid filename passed to start_write function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}